

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int ffimem(fitsfile **fptr,void **buffptr,size_t *buffsize,size_t deltasize,
          _func_void_ptr_void_ptr_size_t *mem_realloc,int *status)

{
  int *piVar1;
  size_t sVar2;
  int *piVar3;
  int iVar4;
  fitsfile *fptr_00;
  FITSfile *pFVar5;
  LONGLONG *pLVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  fitsfile **ppfVar11;
  _func_int_int **pp_Var12;
  char *pcVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int handle;
  char urltype [20];
  int local_74;
  fitsfile **local_70;
  size_t *local_68;
  int *local_60;
  size_t local_58;
  _func_void_ptr_void_ptr_size_t *local_50;
  char local_48 [24];
  
  if (0 < *status) {
    return *status;
  }
  *fptr = (fitsfile *)0x0;
  if (need_to_initialize != 0) {
    iVar4 = fits_init_cfitsio();
    *status = iVar4;
    if (0 < iVar4) {
      return iVar4;
    }
  }
  builtin_strncpy(local_48,"memkeep://",0xb);
  uVar10 = (ulong)(uint)no_of_drivers;
  pp_Var12 = &driverTable[(long)(no_of_drivers + -1) + 1].close;
  pcVar13 = ffbfwt::zeros + uVar10 * 0x98 + 0xab8;
  local_70 = fptr;
  local_68 = buffsize;
  local_60 = status;
  local_58 = deltasize;
  local_50 = mem_realloc;
  do {
    piVar3 = local_60;
    if ((int)uVar10 < 1) {
      *local_60 = 0x7c;
      ffpmsg("could not find driver for pre-existing memory file: (ffimem)");
      return *piVar3;
    }
    iVar4 = strcmp(pcVar13,local_48);
    piVar3 = local_60;
    pp_Var12 = pp_Var12 + -0x13;
    uVar9 = (int)uVar10 - 1;
    uVar10 = (ulong)uVar9;
    pcVar13 = pcVar13 + -0x98;
  } while (iVar4 != 0);
  *local_60 = 0;
  iVar4 = mem_openmem(buffptr,local_68,local_58,local_50,&local_74);
  *piVar3 = iVar4;
  if (iVar4 < 1) {
    fptr_00 = (fitsfile *)calloc(1,0x10);
    *local_70 = fptr_00;
    if (fptr_00 == (fitsfile *)0x0) {
      (**pp_Var12)(local_74);
      ffpmsg("failed to allocate structure for memory file: (ffimem)");
    }
    else {
      pFVar5 = (FITSfile *)calloc(1,0x7e8);
      fptr_00->Fptr = pFVar5;
      if (pFVar5 == (FITSfile *)0x0) {
        (**pp_Var12)(local_74);
        ffpmsg("failed to allocate structure for memory file: (ffimem)");
        ppfVar11 = local_70;
      }
      else {
        pcVar13 = (char *)malloc(0x20);
        pFVar5->filename = pcVar13;
        if (pcVar13 == (char *)0x0) {
          (**pp_Var12)(local_74);
          ffpmsg("failed to allocate memory for filename: (ffimem)");
          ppfVar11 = local_70;
        }
        else {
          pLVar6 = (LONGLONG *)calloc(0x3e9,8);
          pFVar5->headstart = pLVar6;
          if (pLVar6 == (LONGLONG *)0x0) {
            (**pp_Var12)(local_74);
            ffpmsg("failed to allocate memory for headstart array: (ffimem)");
            ppfVar11 = local_70;
          }
          else {
            pcVar7 = (char *)calloc(0x28,0xb40);
            pFVar5->iobuffer = pcVar7;
            if (pcVar7 != (char *)0x0) {
              memset(pFVar5->bufrecnum,0xff,0x140);
              iVar4 = 0;
              iVar14 = 1;
              iVar15 = 2;
              iVar16 = 3;
              lVar8 = 0x1d2;
              do {
                piVar1 = &pFVar5->filehandle + lVar8;
                *piVar1 = iVar4;
                piVar1[1] = iVar14;
                piVar1[2] = iVar15;
                piVar1[3] = iVar16;
                iVar4 = iVar4 + 4;
                iVar14 = iVar14 + 4;
                iVar15 = iVar15 + 4;
                iVar16 = iVar16 + 4;
                lVar8 = lVar8 + 4;
              } while (lVar8 != 0x1fa);
              pFVar5->MAXHDU = 1000;
              pFVar5->filehandle = local_74;
              pFVar5->driver = uVar9;
              builtin_strncpy(pcVar13,"memfile",8);
              sVar2 = *local_68;
              pFVar5->filesize = sVar2;
              pFVar5->logfilesize = sVar2;
              pFVar5->writemode = 1;
              pFVar5->datastart = -1;
              pFVar5->curbuf = -1;
              pFVar5->open_count = 1;
              pFVar5->validcode = 0x22b;
              pFVar5->noextsyntax = 0;
              ffldrc(fptr_00,0,1,piVar3);
              iVar4 = *piVar3;
              if (0 < iVar4) {
                return iVar4;
              }
              lVar8 = 0;
              do {
                if (*(long *)((long)FptrTable + lVar8) == 0) {
                  *(FITSfile **)((long)FptrTable + lVar8) = (*local_70)->Fptr;
                  return iVar4;
                }
                lVar8 = lVar8 + 8;
              } while (lVar8 != 80000);
              return iVar4;
            }
            (**pp_Var12)(local_74);
            ffpmsg("failed to allocate memory for iobuffer array: (ffimem)");
            ppfVar11 = local_70;
            free((*local_70)->Fptr->headstart);
          }
          free((*ppfVar11)->Fptr->filename);
        }
        free((*ppfVar11)->Fptr);
      }
      free(*ppfVar11);
      *ppfVar11 = (fitsfile *)0x0;
    }
    *piVar3 = 0x71;
    iVar4 = 0x71;
  }
  else {
    ffpmsg("failed to open pre-existing memory file: (ffimem)");
    iVar4 = *piVar3;
  }
  return iVar4;
}

Assistant:

int ffimem(fitsfile **fptr,      /* O - FITS file pointer                   */ 
           void **buffptr,       /* I - address of memory pointer           */
           size_t *buffsize,     /* I - size of buffer, in bytes            */
           size_t deltasize,     /* I - increment for future realloc's      */
           void *(*mem_realloc)(void *p, size_t newsize), /* function       */
           int *status)          /* IO - error status                       */

/*
  Create and initialize a new FITS file in memory
*/
{
    int ii, driver, slen;
    char urltype[MAX_PREFIX_LEN];
    int handle;

    if (*status > 0)
        return(*status);

    *fptr = 0;              /* initialize null file pointer */

    if (need_to_initialize)    {        /* this is called only once */
       *status = fits_init_cfitsio();
    }
    
    if (*status > 0)
        return(*status);

    strcpy(urltype, "memkeep://"); /* URL type for pre-existing memory file */

    *status = urltype2driver(urltype, &driver);

    if (*status > 0)
    {
        ffpmsg("could not find driver for pre-existing memory file: (ffimem)");
        return(*status);
    }

    /* call driver routine to "open" the memory file */
    FFLOCK;  /* lock this while searching for vacant handle */
    *status =   mem_openmem( buffptr, buffsize, deltasize,
                            mem_realloc,  &handle);
    FFUNLOCK;

    if (*status > 0)
    {
         ffpmsg("failed to open pre-existing memory file: (ffimem)");
         return(*status);
    }

        /* allocate fitsfile structure and initialize = 0 */
    *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    if (!(*fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for memory file: (ffimem)");
        return(*status = MEMORY_ALLOCATION);
    }

        /* allocate FITSfile structure and initialize = 0 */
    (*fptr)->Fptr = (FITSfile *) calloc(1, sizeof(FITSfile));

    if (!((*fptr)->Fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for memory file: (ffimem)");
        free(*fptr);
        *fptr = 0;       
        return(*status = MEMORY_ALLOCATION);
    }

    slen = 32; /* reserve at least 32 chars */ 
    ((*fptr)->Fptr)->filename = (char *) malloc(slen); /* mem for file name */

    if ( !(((*fptr)->Fptr)->filename) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for filename: (ffimem)");
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for headstart array */
    ((*fptr)->Fptr)->headstart = (LONGLONG *) calloc(1001, sizeof(LONGLONG)); 

    if ( !(((*fptr)->Fptr)->headstart) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for headstart array: (ffimem)");
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for file I/O buffers */
    ((*fptr)->Fptr)->iobuffer = (char *) calloc(NIOBUF, IOBUFLEN);

    if ( !(((*fptr)->Fptr)->iobuffer) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for iobuffer array: (ffimem)");
        free( ((*fptr)->Fptr)->headstart);    /* free memory for headstart array */
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* initialize the ageindex array (relative age of the I/O buffers) */
    /* and initialize the bufrecnum array as being empty */
    for (ii = 0; ii < NIOBUF; ii++)  {
        ((*fptr)->Fptr)->ageindex[ii] = ii;
        ((*fptr)->Fptr)->bufrecnum[ii] = -1;
    }

        /* store the parameters describing the file */
    ((*fptr)->Fptr)->MAXHDU = 1000;              /* initial size of headstart */
    ((*fptr)->Fptr)->filehandle = handle;        /* file handle */
    ((*fptr)->Fptr)->driver = driver;            /* driver number */
    strcpy(((*fptr)->Fptr)->filename, "memfile"); /* dummy filename */
    ((*fptr)->Fptr)->filesize = *buffsize;        /* physical file size */
    ((*fptr)->Fptr)->logfilesize = *buffsize;     /* logical file size */
    ((*fptr)->Fptr)->writemode = 1;               /* read-write mode    */
    ((*fptr)->Fptr)->datastart = DATA_UNDEFINED;  /* unknown start of data */
    ((*fptr)->Fptr)->curbuf = -1;             /* undefined current IO buffer */
    ((*fptr)->Fptr)->open_count = 1;     /* structure is currently used once */
    ((*fptr)->Fptr)->validcode = VALIDSTRUC; /* flag denoting valid structure */
    ((*fptr)->Fptr)->noextsyntax = 0;  /* extended syntax can be used in filename */

    ffldrc(*fptr, 0, IGNORE_EOF, status);     /* initialize first record */
    fits_store_Fptr( (*fptr)->Fptr, status);  /* store Fptr address */
    return(*status); 
}